

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regalloc.cpp
# Opt level: O1

Error __thiscall asmjit::RAPass::resolveCellOffsets(RAPass *this)

{
  RACell *pRVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  RACell *pRVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  uint32_t uVar14;
  
  pRVar5 = this->_memVarCells;
  pRVar1 = this->_memStackCells;
  iVar12 = this->_mem64ByteVarsUsed * 0x40;
  iVar7 = this->_mem32ByteVarsUsed * 0x20 + iVar12;
  iVar11 = this->_mem16ByteVarsUsed * 0x10 + iVar7;
  iVar6 = iVar11 + this->_mem8ByteVarsUsed * 8;
  iVar10 = iVar6 + this->_mem4ByteVarsUsed * 4;
  iVar13 = iVar10 + this->_mem2ByteVarsUsed * 2;
  if (pRVar5 != (RACell *)0x0) {
    iVar9 = 0;
    iVar8 = iVar13;
    do {
      uVar14 = pRVar5->size;
      iVar2 = iVar12;
      iVar13 = iVar8;
      iVar3 = iVar9;
      if ((int)uVar14 < 0x10) {
        switch(uVar14) {
        case 1:
          iVar13 = iVar8 + 1;
          break;
        case 2:
          iVar8 = iVar10;
          iVar10 = iVar10 + 2;
          break;
        default:
          goto switchD_00116d9f_caseD_3;
        case 4:
          iVar8 = iVar6;
          iVar6 = iVar6 + 4;
          break;
        case 8:
          iVar8 = iVar11;
          iVar11 = iVar11 + 8;
        }
      }
      else if (uVar14 == 0x10) {
        iVar8 = iVar7;
        iVar7 = iVar7 + 0x10;
      }
      else if (uVar14 == 0x20) {
        iVar2 = iVar12 + 0x20;
        iVar8 = iVar12;
      }
      else {
        if (uVar14 != 0x40) goto switchD_00116d9f_caseD_3;
        iVar3 = iVar9 + 0x40;
        iVar8 = iVar9;
      }
      iVar9 = iVar3;
      iVar12 = iVar2;
      pRVar5->offset = iVar8;
      pRVar5 = pRVar5->next;
      iVar8 = iVar13;
    } while (pRVar5 != (RACell *)0x0);
  }
  uVar14 = iVar13 + this->_mem1ByteVarsUsed;
  while( true ) {
    if (pRVar1 == (RACell *)0x0) {
      this->_memAllTotal = uVar14;
      return 0;
    }
    uVar4 = pRVar1->alignment;
    if ((uVar4 ^ uVar4 - 1) <= uVar4 - 1) break;
    uVar4 = -uVar4 & (uVar14 + uVar4) - 1;
    pRVar1->offset = uVar4;
    uVar14 = uVar4 + pRVar1->size;
    pRVar1 = pRVar1->next;
  }
  resolveCellOffsets();
switchD_00116d9f_caseD_3:
  DebugUtils::assertionFailed
            ("/workspace/llm4binary/github/license_all_cmakelists_25/chenzhuoyu[P]FastRegExp/thirdparty/asmjit/src/asmjit/base/regalloc.cpp"
             ,0x112,"ASMJIT_NOT_REACHED has been reached");
}

Assistant:

Error RAPass::resolveCellOffsets() {
  RACell* varCell = _memVarCells;
  RACell* stackCell = _memStackCells;

  uint32_t pos64 = 0;
  uint32_t pos32 = pos64 + _mem64ByteVarsUsed * 64;
  uint32_t pos16 = pos32 + _mem32ByteVarsUsed * 32;
  uint32_t pos8  = pos16 + _mem16ByteVarsUsed * 16;
  uint32_t pos4  = pos8  + _mem8ByteVarsUsed  * 8 ;
  uint32_t pos2  = pos4  + _mem4ByteVarsUsed  * 4 ;
  uint32_t pos1  = pos2  + _mem2ByteVarsUsed  * 2 ;

  // Assign home slots.
  while (varCell) {
    uint32_t size = varCell->size;
    uint32_t offset = 0;

    switch (size) {
      case  1: offset = pos1 ; pos1  += 1 ; break;
      case  2: offset = pos2 ; pos2  += 2 ; break;
      case  4: offset = pos4 ; pos4  += 4 ; break;
      case  8: offset = pos8 ; pos8  += 8 ; break;
      case 16: offset = pos16; pos16 += 16; break;
      case 32: offset = pos32; pos32 += 32; break;
      case 64: offset = pos64; pos64 += 64; break;

      default:
        ASMJIT_NOT_REACHED();
    }

    varCell->offset = static_cast<int32_t>(offset);
    varCell = varCell->next;
  }

  // Assign stack slots.
  uint32_t stackPos = pos1 + _mem1ByteVarsUsed;
  while (stackCell) {
    uint32_t size = stackCell->size;
    uint32_t alignment = stackCell->alignment;
    ASMJIT_ASSERT(alignment != 0 && Utils::isPowerOf2(alignment));

    stackPos = Utils::alignTo(stackPos, alignment);
    stackCell->offset = stackPos;
    stackCell = stackCell->next;

    stackPos += size;
  }

  _memAllTotal = stackPos;
  return kErrorOk;
}